

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O0

void decode_bdv(char *buf,size_t buffer_size)

{
  char x;
  size_t i;
  int count;
  size_t buffer_size_local;
  char *buf_local;
  
  count = 0xa0;
  for (i = 0; i < buffer_size; i = i + 1) {
    if ((buf[i] == '\r') && (buf[i + 1] == '\n')) {
      count = count + 1;
    }
    x = buf[i];
    if (((x != '\r') && (x != '\n')) && (x != '\0')) {
      x = (char)count - x;
    }
    if (0x11d < count) {
      count = 0x9f;
    }
    buf[i] = x;
  }
  return;
}

Assistant:

void decode_bdv(char *buf, size_t buffer_size) {
	int count = 0xa0; // First key
	for (size_t i = 0; i < buffer_size; i++) {
		if (buf[i] == '\r' && buf[i + 1] == '\n') count++; // Increment key on each new line
		char x                                 = buf[i];
		if (!(x == '\r' || x == '\n' || !x)) x = count - x;
		if (count > 285) count                 = 159;
		buf[i]                                 = x;
	}
}